

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O1

M44f * anon_unknown.dwarf_8dd1c::createRandomMat
                 (M44f *__return_storage_ptr__,Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float (*pafVar12) [4];
  int j;
  long lVar13;
  int k;
  long lVar14;
  double dVar15;
  V3f s;
  V3f sh;
  V3f r;
  V3f t;
  undefined8 local_a8;
  float local_a0;
  V3f *local_98;
  V3f *local_90;
  V3f local_84;
  double local_78;
  double local_68;
  Vec3<float> local_54;
  Vec3<float> local_48;
  V3f local_3c;
  
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 0xc) = 0.0;
  __return_storage_ptr__->x[0][0] = 1.0;
  __return_storage_ptr__->x[1][1] = 1.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  local_98 = rot;
  local_90 = trans;
  getRandTRS(random,&local_3c,&local_48,&local_84);
  Imath_2_5::Matrix44<float>::translate<float>(__return_storage_ptr__,&local_3c);
  Imath_2_5::Matrix44<float>::rotate<float>(__return_storage_ptr__,&local_48);
  local_68 = (double)Imath_2_5::erand48(random->_state);
  local_78 = (double)Imath_2_5::erand48(random->_state);
  dVar15 = (double)Imath_2_5::erand48(random->_state);
  local_a0 = (float)((1.0 - dVar15) * 1e-06 + dVar15 + dVar15);
  local_a8 = CONCAT44((float)((1.0 - local_78) * 1e-06 + local_78 + local_78),
                      (float)((1.0 - local_68) * 1e-06 + local_68 + local_68));
  lVar13 = 0;
  do {
    dVar15 = (double)Imath_2_5::erand48(random->_state);
    if (0.5 <= (1.0 - dVar15) * 0.0 + dVar15) {
      *(uint *)((long)&local_a8 + lVar13 * 4) = *(uint *)((long)&local_a8 + lVar13 * 4) ^ 0x80000000
      ;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  fVar1 = __return_storage_ptr__->x[0][0];
  fVar2 = __return_storage_ptr__->x[0][1];
  fVar3 = __return_storage_ptr__->x[0][2];
  fVar4 = __return_storage_ptr__->x[0][3];
  fVar5 = __return_storage_ptr__->x[1][0];
  fVar6 = __return_storage_ptr__->x[1][1];
  fVar7 = __return_storage_ptr__->x[1][2];
  fVar8 = __return_storage_ptr__->x[1][3];
  fVar9 = __return_storage_ptr__->x[2][1];
  fVar10 = __return_storage_ptr__->x[2][2];
  fVar11 = __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[2][0] =
       local_a8._4_4_ * fVar1 + local_a0 * fVar5 + __return_storage_ptr__->x[2][0];
  __return_storage_ptr__->x[2][1] = local_a8._4_4_ * fVar2 + local_a0 * fVar6 + fVar9;
  __return_storage_ptr__->x[2][2] = local_a8._4_4_ * fVar3 + local_a0 * fVar7 + fVar10;
  __return_storage_ptr__->x[2][3] = local_a8._4_4_ * fVar4 + local_a0 * fVar8 + fVar11;
  __return_storage_ptr__->x[1][0] = (float)local_a8 * fVar1 + fVar5;
  __return_storage_ptr__->x[1][1] = (float)local_a8 * fVar2 + fVar6;
  __return_storage_ptr__->x[1][2] = (float)local_a8 * fVar3 + fVar7;
  __return_storage_ptr__->x[1][3] = (float)local_a8 * fVar4 + fVar8;
  Imath_2_5::Matrix44<float>::scale<float>(__return_storage_ptr__,&local_84);
  lVar13 = 0;
  pafVar12 = (float (*) [4])__return_storage_ptr__;
  do {
    lVar14 = 0;
    do {
      dVar15 = (double)Imath_2_5::erand48(random->_state);
      (*(float (*) [4])*pafVar12)[lVar14] =
           (float)((double)(*(float (*) [4])*pafVar12)[lVar14] +
                  (1.0 - dVar15) * -1e-07 + dVar15 * 1e-07);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar13 = lVar13 + 1;
    pafVar12 = pafVar12 + 1;
  } while (lVar13 != 4);
  Imath_2_5::extractSHRT<float>
            (__return_storage_ptr__,scale,&local_54,local_98,local_90,true,Default);
  return __return_storage_ptr__;
}

Assistant:

M44f
createRandomMat(Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    
    M44f M;
    V3f t, r, s;
    getRandTRS(random, t, r, s);
    
    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0));

    for (int j=0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5)
            h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += random.nextf (-1e-7, 1e-7);

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));
    
    return M;
}